

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyncExecutor.h
# Opt level: O0

void __thiscall
nrg::SyncExecutor::operator()
          (SyncExecutor *this,_func_void_AsyncResult<int>_AsyncResult<int>_AsyncResult<int>_int *fn,
          AsyncResult<int> *param,AsyncResult<int> *param_3,AsyncResult<int> *param_4,int *param_5)

{
  function<void_()> local_a0;
  undefined1 local_80 [24];
  AsyncResult<int> *local_68;
  int *local_60;
  undefined1 local_58 [8];
  Function f;
  int *param_local_3;
  AsyncResult<int> *param_local_2;
  AsyncResult<int> *param_local_1;
  AsyncResult<int> *param_local;
  _func_void_AsyncResult<int>_AsyncResult<int>_AsyncResult<int>_int *fn_local;
  SyncExecutor *this_local;
  
  local_80._0_8_ = &param_local;
  local_80._8_8_ = param;
  local_80._16_8_ = param_3;
  local_68 = param_4;
  local_60 = param_5;
  f._M_invoker = (_Invoker_type)param_5;
  param_local = (AsyncResult<int> *)fn;
  fn_local = (_func_void_AsyncResult<int>_AsyncResult<int>_AsyncResult<int>_int *)this;
  std::function<void()>::operator()
            ((function<void()> *)local_58,(anon_class_40_5_11abe806 *)local_80);
  std::function<void_()>::function(&local_a0,(function<void_()> *)local_58);
  operator()(this,&local_a0);
  std::function<void_()>::~function(&local_a0);
  std::function<void_()>::~function((function<void_()> *)local_58);
  return;
}

Assistant:

void operator()(FN fn, Param&&... param)
    {
        Function f([&]() { fn(std::forward<Param>(param)...); });
        (*this)(std::move(f));
    }